

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
::emplace_at<std::piecewise_construct_t_const&,std::tuple<cs_impl::any&&>,std::tuple<cs::numeric&&>>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
           *this,size_t i,piecewise_construct_t *args,tuple<cs_impl::any_&&> *args_1,
          tuple<cs::numeric_&&> *args_2)

{
  __gnu_cxx::new_allocator<std::pair<cs_impl::any_const,cs_impl::any>>::
  construct<std::pair<cs_impl::any,cs_impl::any>,std::piecewise_construct_t_const&,std::tuple<cs_impl::any&&>,std::tuple<cs::numeric&&>>
            ((new_allocator<std::pair<cs_impl::any_const,cs_impl::any>> *)(this + 0x28),
             (pair<cs_impl::any,_cs_impl::any> *)(i * 0x10 + *(long *)(this + 8)),args,args_1,args_2
            );
  return;
}

Assistant:

void emplace_at(size_t i, Args&&... args)
			{
				PolicyTraits::construct(&alloc_ref(), slots_ + i,
				                        std::forward<Args>(args)...);

#ifdef PHMAP_CHECK_CONSTRUCTED_VALUE
				// this check can be costly, so do it only when requested
				assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
				       iterator_at(i) &&
				       "constructed value does not match the lookup key");
#endif
			}